

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

void Abc_ExactNormalizeArrivalTimesForNetwork(int nVars,int *pArrTimeProfile,char *pSol)

{
  char *__dest;
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  int *piVar4;
  Vec_Int_t *vLevels;
  int local_30;
  int nMax;
  int k;
  int j;
  int i;
  int nGates;
  char *pSol_local;
  int *pArrTimeProfile_local;
  int nVars_local;
  
  j = (int)pSol[2];
  _i = pSol;
  pSol_local = (char *)pArrTimeProfile;
  pArrTimeProfile_local._4_4_ = nVars;
  p = Vec_IntAllocArrayCopy(pArrTimeProfile,nVars);
  for (k = 0; k < j; k = k + 1) {
    nMax = (int)_i[k * 4 + 5];
    local_30 = (int)_i[k * 4 + 6];
    iVar1 = Vec_IntEntry(p,nMax);
    iVar2 = Vec_IntEntry(p,local_30);
    iVar1 = Abc_MaxInt(iVar1,iVar2);
    Vec_IntPush(p,iVar1 + 1);
  }
  for (k = 0; iVar2 = k, iVar1 = j, k < pArrTimeProfile_local._4_4_ + j + -1; k = k + 1) {
    iVar1 = Vec_IntEntry(p,pArrTimeProfile_local._4_4_ + j + -1);
    Vec_IntSetEntry(p,iVar2,iVar1);
  }
  while (k = iVar1 + -1, -1 < k) {
    iVar1 = (int)_i[k * 4 + 5];
    local_30 = (int)_i[k * 4 + 6];
    nMax = iVar1;
    iVar2 = Vec_IntEntry(p,iVar1);
    iVar3 = Vec_IntEntry(p,pArrTimeProfile_local._4_4_ + k);
    iVar2 = Abc_MinInt(iVar2,iVar3 + -1);
    Vec_IntSetEntry(p,iVar1,iVar2);
    iVar1 = local_30;
    iVar2 = Vec_IntEntry(p,local_30);
    iVar3 = Vec_IntEntry(p,pArrTimeProfile_local._4_4_ + k);
    iVar2 = Abc_MinInt(iVar2,iVar3 + -1);
    Vec_IntSetEntry(p,iVar1,iVar2);
    iVar1 = k;
  }
  piVar4 = Vec_IntArray(p);
  Abc_NormalizeArrivalTimes(piVar4,pArrTimeProfile_local._4_4_,(int *)((long)&vLevels + 4));
  __dest = pSol_local;
  piVar4 = Vec_IntArray(p);
  memcpy(__dest,piVar4,(long)pArrTimeProfile_local._4_4_ << 2);
  Vec_IntFree(p);
  return;
}

Assistant:

static void Abc_ExactNormalizeArrivalTimesForNetwork( int nVars, int * pArrTimeProfile, char * pSol )
{
    int nGates, i, j, k, nMax;
    Vec_Int_t * vLevels;

    nGates = pSol[ABC_EXACT_SOL_NGATES];

    /* printf( "NORMALIZE\n" ); */
    /* printf( "  #vars  = %d\n", nVars ); */
    /* printf( "  #gates = %d\n", nGates ); */

    vLevels = Vec_IntAllocArrayCopy( pArrTimeProfile, nVars );

    /* compute level of each gate based on arrival time profile (to compute depth) */
    for ( i = 0; i < nGates; ++i )
    {
        j = pSol[3 + i * 4 + 2];
        k = pSol[3 + i * 4 + 3];

        Vec_IntPush( vLevels, Abc_MaxInt( Vec_IntEntry( vLevels, j ), Vec_IntEntry( vLevels, k ) ) + 1 );

        /* printf( "  gate %d = (%d,%d)\n", nVars + i, j, k ); */
    }

    /* Vec_IntPrint( vLevels ); */

    /* reset all levels except for the last one */
    for ( i = 0; i < nVars + nGates - 1; ++i )
        Vec_IntSetEntry( vLevels, i, Vec_IntEntry( vLevels, nVars + nGates - 1 ) );

    /* Vec_IntPrint( vLevels ); */

    /* compute levels from top to bottom */
    for ( i = nGates - 1; i >= 0; --i )
    {
        j = pSol[3 + i * 4 + 2];
        k = pSol[3 + i * 4 + 3];

        Vec_IntSetEntry( vLevels, j, Abc_MinInt( Vec_IntEntry( vLevels, j ), Vec_IntEntry( vLevels, nVars + i ) - 1 ) );
        Vec_IntSetEntry( vLevels, k, Abc_MinInt( Vec_IntEntry( vLevels, k ), Vec_IntEntry( vLevels, nVars + i ) - 1 ) );
    }

    /* Vec_IntPrint( vLevels ); */

    /* normalize arrival times */
    Abc_NormalizeArrivalTimes( Vec_IntArray( vLevels ), nVars, &nMax );
    memcpy( pArrTimeProfile, Vec_IntArray( vLevels ), sizeof(int) * nVars );

    /* printf( "  nMax = %d\n", nMax ); */
    /* Vec_IntPrint( vLevels ); */

    Vec_IntFree( vLevels );
}